

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

wchar_t archive_write_mtree_header(archive_write *a,archive_entry *entry)

{
  undefined8 *puVar1;
  size_t sVar2;
  int64_t iVar3;
  unsigned_long uVar4;
  time_t tVar5;
  dev_t dVar6;
  bool bVar7;
  archive_string *dest;
  mode_t mVar8;
  wchar_t wVar9;
  int iVar10;
  wchar_t wVar11;
  uint uVar12;
  la_int64_t lVar13;
  mtree_entry_conflict *pmVar14;
  archive_entry *entry_00;
  time_t t;
  char *pcVar15;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar16;
  char *pcVar17;
  ulong uVar18;
  char *n;
  mtree_entry_conflict *pmVar19;
  mtree_entry_conflict *me;
  mtree_entry_conflict *local_170;
  archive_string local_168;
  char *local_150;
  archive_string *local_148;
  mtree_entry_conflict *local_140;
  char name [256];
  
  puVar1 = (undefined8 *)a->format_data;
  if (*(int *)(puVar1 + 0xe) != 0) {
    *(undefined4 *)(puVar1 + 0xe) = 0;
    archive_strcat((archive_string *)(puVar1 + 0xb),"#mtree\n");
    if ((*(uint *)(puVar1 + 0x24) & 0x380238) == 0) {
      *(undefined4 *)((long)puVar1 + 300) = 0;
    }
  }
  lVar13 = archive_entry_size(entry);
  puVar1[0xf] = lVar13;
  if ((*(int *)((long)puVar1 + 0x124) != 0) &&
     (mVar8 = archive_entry_filetype(entry), mVar8 != 0x4000)) {
    return L'\0';
  }
  wVar9 = mtree_entry_new(a,entry,&local_170);
  me = local_170;
  if (wVar9 < L'\xffffffec') {
    return wVar9;
  }
  pcVar15 = (char *)a->format_data;
  sVar2 = (local_170->parentdir).length;
  if (sVar2 == 0) {
    if (((local_170->basename).length != 1) || (*(local_170->basename).s != '.')) {
      pcVar15 = (local_170->pathname).s;
      pcVar17 = "Internal programming error in generating canonical name for %s";
      goto LAB_004beaf5;
    }
    local_170->parent = local_170;
    pmVar14 = *(mtree_entry_conflict **)(pcVar15 + 8);
    if (pmVar14 == (mtree_entry_conflict *)0x0) {
      *(mtree_entry_conflict **)(pcVar15 + 8) = local_170;
      local_170->next = (mtree_entry_conflict *)0x0;
      **(undefined8 **)(pcVar15 + 0x38) = local_170;
      *(mtree_entry_conflict ***)(pcVar15 + 0x38) = &local_170->next;
      goto LAB_004bec22;
    }
  }
  else {
    pcVar17 = (local_170->parentdir).s;
    pcVar16 = extraout_RDX;
    if ((*(size_t *)(pcVar15 + 0x20) != sVar2) ||
       (iVar10 = strcmp(((archive_string *)(pcVar15 + 0x18))->s,pcVar17), pcVar16 = extraout_RDX_00,
       iVar10 != 0)) {
      n = pcVar17;
      pmVar19 = *(mtree_entry_conflict **)(pcVar15 + 8);
      local_148 = (archive_string *)(pcVar15 + 0x18);
LAB_004be6ef:
      wVar11 = get_path_component(name,(size_t)n,pcVar16);
      pcVar16 = pcVar17;
      if (wVar11 != L'\0') {
        if (wVar11 < L'\0') {
          wVar11 = L'\xffffffe2';
          archive_set_error(&a->archive,-1,"A name buffer is too small");
          goto LAB_004beb05;
        }
        uVar18 = (ulong)(uint)wVar11;
        if (((wVar11 == L'\x01') && (name[0] == '.')) && (pmVar19 != (mtree_entry_conflict *)0x0)) {
          if (pmVar19 == *(mtree_entry_conflict **)(pcVar15 + 8)) {
            pcVar16 = extraout_RDX_01;
            if (n[1] == '/') {
              n = n + 2;
            }
            else {
              n = n + 1;
            }
            goto LAB_004be6ef;
          }
        }
        else if (pmVar19 == (mtree_entry_conflict *)0x0) {
          pmVar19 = (mtree_entry_conflict *)0x0;
          goto LAB_004be7e7;
        }
        pmVar14 = (mtree_entry_conflict *)
                  __archive_rb_tree_find_node(&pmVar19->dir_info->rbtree,name);
        if (pmVar14 == (mtree_entry_conflict *)0x0) goto LAB_004be7e7;
        if (*n == '\0') goto LAB_004bead7;
        if (pmVar14->dir_info == (dir_info *)0x0) {
          archive_set_error(&a->archive,-1,"`%s\' is not directory, we cannot insert `%s\' ",
                            (pmVar14->pathname).s,(me->pathname).s);
          goto LAB_004beb02;
        }
        pcVar16 = n + (n[uVar18] == '/') + uVar18;
        n = pcVar16;
        pmVar19 = pmVar14;
        goto LAB_004be6ef;
      }
      uVar18 = 0;
LAB_004be7e7:
      do {
        local_150 = pcVar16;
        dest = local_148;
        if (*n == '\0') goto LAB_004be9c2;
        local_168.s = (char *)0x0;
        local_168.length = 0;
        local_168.buffer_length = 0;
        archive_strncat(&local_168,pcVar17,(size_t)(n + (uVar18 - (long)pcVar17)));
        pcVar17 = local_168.s;
        if (local_168.s[local_168.length - 1] == '/') {
          local_168.s[local_168.length - 1] = '\0';
          local_168.length = local_168.length - 1;
        }
        entry_00 = archive_entry_new();
        if (entry_00 == (archive_entry *)0x0) {
LAB_004be8a3:
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
          bVar7 = true;
          wVar11 = L'\xffffffe2';
          pmVar14 = (mtree_entry_conflict *)0x0;
        }
        else {
          archive_entry_copy_pathname(entry_00,pcVar17);
          archive_entry_set_mode(entry_00,0x41ed);
          t = time((time_t *)0x0);
          archive_entry_set_mtime(entry_00,t,0);
          wVar11 = mtree_entry_new(a,entry_00,&local_140);
          archive_entry_free(entry_00);
          if (wVar11 < L'\xffffffec') goto LAB_004be8a3;
          local_140->dir_info->virtual = L'\x01';
          bVar7 = false;
          wVar11 = L'\0';
          pmVar14 = local_140;
        }
        archive_string_free(&local_168);
        if (bVar7) goto LAB_004beb05;
        pcVar17 = (pmVar14->pathname).s;
        if ((*pcVar17 == '.') && (pcVar17[1] == '\0')) {
          *(mtree_entry_conflict **)(pcVar15 + 8) = pmVar14;
          pmVar19 = pmVar14;
        }
        else {
          __archive_rb_tree_insert_node(&pmVar19->dir_info->rbtree,&pmVar14->rbnode);
        }
        pcVar17 = local_150;
        pmVar14->parent = pmVar19;
        pmVar14->next = (mtree_entry_conflict *)0x0;
        **(undefined8 **)(pcVar15 + 0x38) = pmVar14;
        *(mtree_entry_conflict ***)(pcVar15 + 0x38) = &pmVar14->next;
        n = n + (n[uVar18] == '/') + uVar18;
        wVar11 = get_path_component(name,(size_t)n,pcVar15);
        if (wVar11 < L'\0') {
          archive_string_free(&local_168);
          archive_set_error(&a->archive,-1,"A name buffer is too small");
          wVar11 = L'\xffffffe2';
          goto LAB_004beb05;
        }
        uVar18 = (ulong)(uint)wVar11;
        pmVar19 = pmVar14;
        pcVar16 = local_150;
      } while( true );
    }
    iVar10 = __archive_rb_tree_insert_node
                       (*(archive_rb_tree **)(*(long *)(pcVar15 + 0x10) + 0x28),&me->rbnode);
    if (iVar10 != 0) {
      me->parent = *(mtree_entry_conflict **)(pcVar15 + 0x10);
      me->next = (mtree_entry_conflict *)0x0;
      **(undefined8 **)(pcVar15 + 0x38) = me;
      *(mtree_entry_conflict ***)(pcVar15 + 0x38) = &me->next;
      goto LAB_004bec22;
    }
    pmVar14 = (mtree_entry_conflict *)
              __archive_rb_tree_find_node
                        (&(*(mtree_entry_conflict **)(pcVar15 + 0x10))->dir_info->rbtree,
                         (me->basename).s);
  }
LAB_004bead7:
  if (((me->mode ^ pmVar14->mode) & 0xf000) != 0) {
    pcVar15 = (pmVar14->pathname).s;
    pcVar17 = "Found duplicate entries `%s\' and its file type is different";
LAB_004beaf5:
    archive_set_error(&a->archive,-1,pcVar17,pcVar15);
LAB_004beb02:
    wVar11 = L'\xffffffe7';
LAB_004beb05:
    mtree_entry_free(local_170);
    return wVar11;
  }
  (pmVar14->symlink).length = 0;
  archive_string_concat(&pmVar14->symlink,&me->symlink);
  (pmVar14->uname).length = 0;
  archive_string_concat(&pmVar14->uname,&me->uname);
  (pmVar14->gname).length = 0;
  archive_string_concat(&pmVar14->gname,&me->gname);
  (pmVar14->fflags_text).length = 0;
  archive_string_concat(&pmVar14->fflags_text,&me->fflags_text);
  mVar8 = me->filetype;
  pmVar14->nlink = me->nlink;
  pmVar14->filetype = mVar8;
  pmVar14->mode = me->mode;
  iVar3 = me->uid;
  pmVar14->size = me->size;
  pmVar14->uid = iVar3;
  uVar4 = me->fflags_clear;
  pmVar14->fflags_set = me->fflags_set;
  pmVar14->fflags_clear = uVar4;
  tVar5 = me->mtime;
  pmVar14->gid = me->gid;
  pmVar14->mtime = tVar5;
  pmVar14->mtime_nsec = me->mtime_nsec;
  dVar6 = me->rdevminor;
  pmVar14->rdevmajor = me->rdevmajor;
  pmVar14->rdevminor = dVar6;
  dVar6 = me->devminor;
  pmVar14->devmajor = me->devmajor;
  pmVar14->devminor = dVar6;
  pmVar14->ino = me->ino;
  if (pmVar14->dir_info != (dir_info *)0x0) {
    pmVar14->dir_info->virtual = L'\0';
  }
  mtree_entry_free(me);
  me = pmVar14;
LAB_004bec22:
  *puVar1 = me;
  if (me->reg_info != (reg_info *)0x0) {
    *(undefined4 *)(puVar1 + 0x1c) = 0;
    uVar12 = *(uint *)(puVar1 + 0x24);
    if ((uVar12 & 1) != 0) {
      puVar1[0x1c] = 1;
      puVar1[0x1d] = 0;
    }
    if ((uVar12 >> 8 & 1) != 0) {
      iVar10 = __archive_md5init((archive_md5_ctx *)(puVar1 + 0x1e));
      if (iVar10 == 0) {
        *(byte *)((long)puVar1 + 0xe1) = *(byte *)((long)puVar1 + 0xe1) | 1;
        uVar12 = *(uint *)(puVar1 + 0x24);
      }
      else {
        uVar12 = *(uint *)(puVar1 + 0x24) & 0xfffffeff;
        *(uint *)(puVar1 + 0x24) = uVar12;
      }
    }
    if ((uVar12 >> 0xd & 1) != 0) {
      iVar10 = __archive_ripemd160init((archive_rmd160_ctx *)(puVar1 + 0x1f));
      if (iVar10 == 0) {
        *(byte *)((long)puVar1 + 0xe1) = *(byte *)((long)puVar1 + 0xe1) | 0x20;
        uVar12 = *(uint *)(puVar1 + 0x24);
      }
      else {
        uVar12 = *(uint *)(puVar1 + 0x24) & 0xffffdfff;
        *(uint *)(puVar1 + 0x24) = uVar12;
      }
    }
    if ((uVar12 >> 0xe & 1) != 0) {
      iVar10 = __archive_sha1init((archive_sha1_ctx *)(puVar1 + 0x20));
      if (iVar10 == 0) {
        *(byte *)((long)puVar1 + 0xe1) = *(byte *)((long)puVar1 + 0xe1) | 0x40;
        uVar12 = *(uint *)(puVar1 + 0x24);
      }
      else {
        uVar12 = *(uint *)(puVar1 + 0x24) & 0xffffbfff;
        *(uint *)(puVar1 + 0x24) = uVar12;
      }
    }
    if ((uVar12 >> 0x17 & 1) != 0) {
      iVar10 = __archive_sha256init((archive_sha256_ctx *)(puVar1 + 0x21));
      if (iVar10 == 0) {
        *(byte *)((long)puVar1 + 0xe2) = *(byte *)((long)puVar1 + 0xe2) | 0x80;
        uVar12 = *(uint *)(puVar1 + 0x24);
      }
      else {
        uVar12 = *(uint *)(puVar1 + 0x24) & 0xff7fffff;
        *(uint *)(puVar1 + 0x24) = uVar12;
      }
    }
    if ((uVar12 >> 0x18 & 1) != 0) {
      iVar10 = __archive_sha384init((archive_sha384_ctx *)(puVar1 + 0x22));
      if (iVar10 == 0) {
        *(byte *)((long)puVar1 + 0xe3) = *(byte *)((long)puVar1 + 0xe3) | 1;
        uVar12 = *(uint *)(puVar1 + 0x24);
      }
      else {
        uVar12 = *(uint *)(puVar1 + 0x24) & 0xfeffffff;
        *(uint *)(puVar1 + 0x24) = uVar12;
      }
    }
    if ((uVar12 >> 0x19 & 1) != 0) {
      iVar10 = __archive_sha512init((archive_sha512_ctx *)(puVar1 + 0x23));
      if (iVar10 == 0) {
        *(byte *)((long)puVar1 + 0xe3) = *(byte *)((long)puVar1 + 0xe3) | 2;
      }
      else {
        *(byte *)((long)puVar1 + 0x123) = *(byte *)((long)puVar1 + 0x123) & 0xfd;
      }
    }
  }
  return wVar9;
LAB_004be9c2:
  *(mtree_entry_conflict **)(pcVar15 + 0x10) = pmVar19;
  pcVar15[0x20] = '\0';
  pcVar15[0x21] = '\0';
  pcVar15[0x22] = '\0';
  pcVar15[0x23] = '\0';
  pcVar15[0x24] = '\0';
  pcVar15[0x25] = '\0';
  pcVar15[0x26] = '\0';
  pcVar15[0x27] = '\0';
  archive_string_ensure(local_148,(pmVar19->parentdir).length + (pmVar19->basename).length + 2);
  sVar2 = (pmVar19->parentdir).length;
  if ((pmVar19->basename).length + sVar2 == 0) {
    *dest->s = '\0';
  }
  else {
    if (sVar2 != 0) {
      pcVar15[0x20] = '\0';
      pcVar15[0x21] = '\0';
      pcVar15[0x22] = '\0';
      pcVar15[0x23] = '\0';
      pcVar15[0x24] = '\0';
      pcVar15[0x25] = '\0';
      pcVar15[0x26] = '\0';
      pcVar15[0x27] = '\0';
      archive_string_concat(dest,&pmVar19->parentdir);
      archive_strappend_char(dest,'/');
    }
    archive_string_concat(dest,&pmVar19->basename);
  }
  iVar10 = __archive_rb_tree_insert_node(&pmVar19->dir_info->rbtree,&me->rbnode);
  if (iVar10 != 0) {
    me->parent = pmVar19;
    me->next = (mtree_entry_conflict *)0x0;
    **(undefined8 **)(pcVar15 + 0x38) = me;
    *(mtree_entry_conflict ***)(pcVar15 + 0x38) = &me->next;
    me = local_170;
    goto LAB_004bec22;
  }
  pmVar14 = (mtree_entry_conflict *)
            __archive_rb_tree_find_node(&pmVar19->dir_info->rbtree,(me->basename).s);
  goto LAB_004bead7;
}

Assistant:

static int
archive_write_mtree_header(struct archive_write *a,
    struct archive_entry *entry)
{
	struct mtree_writer *mtree= a->format_data;
	struct mtree_entry *mtree_entry;
	int r, r2;

	if (mtree->first) {
		mtree->first = 0;
		archive_strcat(&mtree->buf, "#mtree\n");
		if ((mtree->keys & SET_KEYS) == 0)
			mtree->output_global_set = 0;/* Disabled. */
	}

	mtree->entry_bytes_remaining = archive_entry_size(entry);

	/* While directory only mode, we do not handle non directory files. */
	if (mtree->dironly && archive_entry_filetype(entry) != AE_IFDIR)
		return (ARCHIVE_OK);

	r2 = mtree_entry_new(a, entry, &mtree_entry);
	if (r2 < ARCHIVE_WARN)
		return (r2);
	r = mtree_entry_tree_add(a, &mtree_entry);
	if (r < ARCHIVE_WARN) {
		mtree_entry_free(mtree_entry);
		return (r);
	}
	mtree->mtree_entry = mtree_entry;

	/* If the current file is a regular file, we have to
	 * compute the sum of its content.
	 * Initialize a bunch of checksum context. */
	if (mtree_entry->reg_info)
		sum_init(mtree);

	return (r2);
}